

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int ffffrw(fitsfile *fptr,char *expr,long *rownum,int *status)

{
  long lVar1;
  int iVar2;
  long nelem;
  int dtype;
  int naxis;
  ffffrw_workdata workData;
  ParseData lParse;
  long naxes [5];
  
  if (*status != 0) {
    return *status;
  }
  iVar2 = ffiprs(fptr,0,expr,5,&dtype,&nelem,&naxis,naxes,&lParse,status);
  lVar1 = nelem;
  if (iVar2 == 0) {
    if (nelem < 0) {
      nelem = -nelem;
    }
    if ((dtype != 0xe) || (nelem != 1)) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      *status = 0x1b0;
      return 0x1b0;
    }
    *rownum = 0;
    if (lVar1 < 0) {
      if ((lParse.Nodes[lParse.resultNode].value.data.log != '\0') &&
         (ffgnrw(fptr,&nelem,status), nelem != 0)) {
        *rownum = 1;
      }
    }
    else {
      workData.prownum = rownum;
      workData.lParse = &lParse;
      iVar2 = ffiter(lParse.nCols,lParse.colData,0,0,ffffrw_work,&workData,status);
      if (iVar2 == -1) {
        *status = 0;
      }
    }
  }
  ffcprs(&lParse);
  return *status;
}

Assistant:

int ffffrw( fitsfile *fptr,         /* I - Input FITS file                   */
            char     *expr,         /* I - Boolean expression                */
            long     *rownum,       /* O - First row of table to eval to T   */
            int      *status )      /* O - Error status                      */
/*                                                                           */
/* Evaluate a boolean expression, returning the row number of the first      */
/* row which evaluates to TRUE                                               */
/*---------------------------------------------------------------------------*/
{
   int naxis, constant, dtype;
   long nelem, naxes[MAXDIMS];
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   if( ffiprs( fptr, 0, expr, MAXDIMS, &dtype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   if( dtype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   *rownum = 0;
   if( constant ) { /* No need to call parser... have result from ffiprs */
      result = lParse.Nodes[lParse.resultNode].value.data.log;
      if( result ) {
         /*  Make sure there is at least 1 row in table  */
         ffgnrw( fptr, &nelem, status );
         if( nelem )
            *rownum = 1;
      }
   } else {
      ffffrw_workdata workData;
      workData.prownum = rownum;
      workData.lParse = &lParse;
      if( ffiter( lParse.nCols, lParse.colData, 0, 0,
                  ffffrw_work, (void*)&workData, status ) == -1 )
         *status = 0;  /* -1 indicates exitted without error before end... OK */
   }

   ffcprs(&lParse);
   return(*status);
}